

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O1

int run_test_udp_open(void)

{
  int iVar1;
  uint uVar2;
  int extraout_EAX;
  uint uVar3;
  int extraout_EAX_00;
  undefined8 uVar4;
  undefined1 *puVar5;
  undefined4 *in_RCX;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  ulong unaff_RBX;
  ulong uVar6;
  ulong uVar7;
  undefined1 *puVar8;
  int in_R8D;
  uv_buf_t buf;
  sockaddr_in addr;
  uv_udp_t client;
  uv_udp_t client2;
  undefined1 auStack_868 [16];
  sockaddr sStack_858;
  undefined2 uStack_848;
  undefined1 uStack_846;
  undefined5 uStack_845;
  undefined8 uStack_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined6 uStack_800;
  undefined2 uStack_7fa;
  undefined6 uStack_7f8;
  undefined8 uStack_7f2;
  undefined1 auStack_7e8 [216];
  undefined1 auStack_710 [320];
  ulong uStack_5d0;
  code *pcStack_5c8;
  undefined1 auStack_5c0 [16];
  sockaddr sStack_5b0;
  undefined1 auStack_5a0 [96];
  long lStack_540;
  undefined1 auStack_4c8 [216];
  code *pcStack_3f0;
  sockaddr sStack_3e0;
  undefined1 auStack_3d0 [216];
  code *pcStack_2f8;
  undefined1 auStack_2f0 [216];
  ulong uStack_218;
  undefined4 uStack_1e4;
  code *pcStack_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [96];
  long local_158;
  undefined1 local_e0 [216];
  
  pcStack_1e0 = (code *)0x18958d;
  local_1d8 = uv_buf_init("PING",4);
  pcStack_1e0 = (code *)0x1895ac;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_1c8);
  if (iVar1 == 0) {
    pcStack_1e0 = (code *)0x1895b9;
    uVar2 = create_udp_socket();
    unaff_RBX = (ulong)uVar2;
    pcStack_1e0 = (code *)0x1895c0;
    uVar4 = uv_default_loop();
    pcStack_1e0 = (code *)0x1895cd;
    iVar1 = uv_udp_init(uVar4,local_1b8);
    if (iVar1 != 0) goto LAB_0018970c;
    pcStack_1e0 = (code *)0x1895e1;
    iVar1 = uv_udp_open(local_1b8,uVar2);
    if (iVar1 != 0) goto LAB_00189711;
    pcStack_1e0 = (code *)0x1895fa;
    iVar1 = uv_udp_bind(local_1b8,local_1c8,0);
    if (iVar1 != 0) goto LAB_00189716;
    pcStack_1e0 = (code *)0x18961a;
    iVar1 = uv_udp_recv_start(local_1b8,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_0018971b;
    puVar8 = local_1c8;
    in_RCX = (undefined4 *)0x1;
    pcStack_1e0 = (code *)0x189647;
    iVar1 = uv_udp_send(&send_req,local_1b8,local_1d8,1,puVar8,send_cb);
    in_R8D = (int)puVar8;
    if (iVar1 != 0) goto LAB_00189720;
    pcStack_1e0 = (code *)0x189654;
    uVar4 = uv_default_loop();
    pcStack_1e0 = (code *)0x189664;
    iVar1 = uv_udp_init(uVar4,local_e0);
    if (iVar1 != 0) goto LAB_00189725;
    pcStack_1e0 = (code *)0x18967b;
    iVar1 = uv_udp_open(local_e0,uVar2);
    if (iVar1 != -0x11) goto LAB_0018972a;
    pcStack_1e0 = (code *)0x189693;
    uv_close(local_e0,0);
    pcStack_1e0 = (code *)0x189698;
    uVar4 = uv_default_loop();
    pcStack_1e0 = (code *)0x1896a2;
    uv_run(uVar4,0);
    if (send_cb_called != 1) goto LAB_0018972f;
    if (close_cb_called != 1) goto LAB_00189734;
    if (local_158 != 0) goto LAB_00189739;
    pcStack_1e0 = (code *)0x1896c8;
    unaff_RBX = uv_default_loop();
    pcStack_1e0 = (code *)0x1896dc;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_1e0 = (code *)0x1896e6;
    uv_run(unaff_RBX,0);
    pcStack_1e0 = (code *)0x1896eb;
    uVar4 = uv_default_loop();
    pcStack_1e0 = (code *)0x1896f3;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      pcStack_1e0 = (code *)0x1896fc;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_1e0 = (code *)0x18970c;
    run_test_udp_open_cold_1();
LAB_0018970c:
    pcStack_1e0 = (code *)0x189711;
    run_test_udp_open_cold_2();
LAB_00189711:
    pcStack_1e0 = (code *)0x189716;
    run_test_udp_open_cold_3();
LAB_00189716:
    pcStack_1e0 = (code *)0x18971b;
    run_test_udp_open_cold_4();
LAB_0018971b:
    pcStack_1e0 = (code *)0x189720;
    run_test_udp_open_cold_5();
LAB_00189720:
    pcStack_1e0 = (code *)0x189725;
    run_test_udp_open_cold_6();
LAB_00189725:
    pcStack_1e0 = (code *)0x18972a;
    run_test_udp_open_cold_7();
LAB_0018972a:
    pcStack_1e0 = (code *)0x18972f;
    run_test_udp_open_cold_8();
LAB_0018972f:
    pcStack_1e0 = (code *)0x189734;
    run_test_udp_open_cold_9();
LAB_00189734:
    pcStack_1e0 = (code *)0x189739;
    run_test_udp_open_cold_10();
LAB_00189739:
    pcStack_1e0 = (code *)0x18973e;
    run_test_udp_open_cold_11();
  }
  pcStack_1e0 = create_udp_socket;
  run_test_udp_open_cold_12();
  uVar7 = 2;
  uVar6 = 2;
  pcStack_1e0 = (code *)unaff_RBX;
  uVar2 = socket(2,2,0);
  if ((int)uVar2 < 0) {
    create_udp_socket_cold_1();
  }
  else {
    unaff_RBX = (ulong)uVar2;
    in_RCX = &uStack_1e4;
    uStack_1e4 = 1;
    uVar7 = (ulong)uVar2;
    uVar6 = 1;
    in_R8D = 4;
    iVar1 = setsockopt(uVar2,1,2,in_RCX,4);
    if (iVar1 == 0) {
      return uVar2;
    }
  }
  create_udp_socket_cold_2();
  if (uVar6 < 0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x57fd00;
  }
  alloc_cb_cold_1();
  if ((long)uVar6 < 0) {
    recv_cb_cold_7();
LAB_00189804:
    recv_cb_cold_1();
LAB_00189809:
    recv_cb_cold_5();
LAB_0018980e:
    recv_cb_cold_2();
LAB_00189813:
    recv_cb_cold_3();
LAB_00189818:
    recv_cb_cold_4();
  }
  else {
    if (uVar6 != 0) {
      if (in_R8D != 0) goto LAB_00189804;
      if (in_RCX == (undefined4 *)0x0) goto LAB_00189809;
      if (uVar6 != 4) goto LAB_0018980e;
      if (*(int *)*extraout_RDX_00 != 0x474e4950) goto LAB_00189813;
      iVar1 = uv_udp_recv_stop();
      unaff_RBX = uVar7;
      if (iVar1 == 0) {
        iVar1 = uv_close(uVar7,close_cb);
        return iVar1;
      }
      goto LAB_00189818;
    }
    if (in_RCX == (undefined4 *)0x0) {
      return extraout_EAX;
    }
  }
  iVar1 = (int)uVar6;
  recv_cb_cold_6();
  if (in_RCX == (undefined4 *)0x0) {
    send_cb_cold_2();
  }
  else if (iVar1 == 0) {
    send_cb_called = send_cb_called + 1;
    iVar1 = uv_close(*(undefined8 *)(in_RCX + 0x10),close_cb);
    return iVar1;
  }
  send_cb_cold_1();
  pcStack_2f8 = (code *)0x18985e;
  uStack_218 = unaff_RBX;
  uVar2 = create_udp_socket();
  pcStack_2f8 = (code *)0x189865;
  uVar3 = create_udp_socket();
  uVar6 = (ulong)uVar3;
  pcStack_2f8 = (code *)0x18986c;
  uVar4 = uv_default_loop();
  pcStack_2f8 = (code *)0x189877;
  iVar1 = uv_udp_init(uVar4,auStack_2f0);
  if (iVar1 == 0) {
    pcStack_2f8 = (code *)0x189889;
    iVar1 = uv_udp_open(auStack_2f0,uVar2);
    if (iVar1 != 0) goto LAB_0018990a;
    pcStack_2f8 = (code *)0x189897;
    iVar1 = uv_udp_open(auStack_2f0,uVar3);
    if (iVar1 != -0x10) goto LAB_0018990f;
    pcStack_2f8 = (code *)0x1898a3;
    iVar1 = close(uVar3);
    if (iVar1 != 0) goto LAB_00189914;
    pcStack_2f8 = (code *)0x1898b1;
    uv_close(auStack_2f0,0);
    pcStack_2f8 = (code *)0x1898b6;
    uVar4 = uv_default_loop();
    pcStack_2f8 = (code *)0x1898c0;
    uv_run(uVar4,0);
    pcStack_2f8 = (code *)0x1898c5;
    uVar6 = uv_default_loop();
    pcStack_2f8 = (code *)0x1898d9;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_2f8 = (code *)0x1898e3;
    uv_run(uVar6,0);
    pcStack_2f8 = (code *)0x1898e8;
    uVar4 = uv_default_loop();
    pcStack_2f8 = (code *)0x1898f0;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      pcStack_2f8 = (code *)0x1898f9;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_2f8 = (code *)0x18990a;
    run_test_udp_open_twice_cold_1();
LAB_0018990a:
    pcStack_2f8 = (code *)0x18990f;
    run_test_udp_open_twice_cold_2();
LAB_0018990f:
    pcStack_2f8 = (code *)0x189914;
    run_test_udp_open_twice_cold_3();
LAB_00189914:
    pcStack_2f8 = (code *)0x189919;
    run_test_udp_open_twice_cold_4();
  }
  pcStack_2f8 = run_test_udp_open_bound;
  run_test_udp_open_twice_cold_5();
  pcStack_3f0 = (code *)0x18993c;
  pcStack_2f8 = (code *)uVar6;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_3e0);
  if (iVar1 == 0) {
    pcStack_3f0 = (code *)0x189949;
    uVar3 = create_udp_socket();
    uVar6 = (ulong)uVar3;
    pcStack_3f0 = (code *)0x18995c;
    iVar1 = bind(uVar3,&sStack_3e0,0x10);
    if (iVar1 != 0) goto LAB_00189a12;
    pcStack_3f0 = (code *)0x189969;
    uVar4 = uv_default_loop();
    pcStack_3f0 = (code *)0x189976;
    iVar1 = uv_udp_init(uVar4,auStack_3d0);
    if (iVar1 != 0) goto LAB_00189a17;
    pcStack_3f0 = (code *)0x18998a;
    iVar1 = uv_udp_open(auStack_3d0,uVar3);
    if (iVar1 != 0) goto LAB_00189a1c;
    pcStack_3f0 = (code *)0x1899aa;
    iVar1 = uv_udp_recv_start(auStack_3d0,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00189a21;
    pcStack_3f0 = (code *)0x1899ba;
    uv_close(auStack_3d0,0);
    pcStack_3f0 = (code *)0x1899bf;
    uVar4 = uv_default_loop();
    pcStack_3f0 = (code *)0x1899c9;
    uv_run(uVar4,0);
    pcStack_3f0 = (code *)0x1899ce;
    uVar6 = uv_default_loop();
    pcStack_3f0 = (code *)0x1899e2;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_3f0 = (code *)0x1899ec;
    uv_run(uVar6,0);
    pcStack_3f0 = (code *)0x1899f1;
    uVar4 = uv_default_loop();
    pcStack_3f0 = (code *)0x1899f9;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      pcStack_3f0 = (code *)0x189a02;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_3f0 = (code *)0x189a12;
    run_test_udp_open_bound_cold_1();
LAB_00189a12:
    pcStack_3f0 = (code *)0x189a17;
    run_test_udp_open_bound_cold_2();
LAB_00189a17:
    pcStack_3f0 = (code *)0x189a1c;
    run_test_udp_open_bound_cold_3();
LAB_00189a1c:
    pcStack_3f0 = (code *)0x189a21;
    run_test_udp_open_bound_cold_4();
LAB_00189a21:
    pcStack_3f0 = (code *)0x189a26;
    run_test_udp_open_bound_cold_5();
  }
  pcStack_3f0 = run_test_udp_open_connect;
  run_test_udp_open_bound_cold_6();
  pcStack_5c8 = (code *)0x189a44;
  pcStack_3f0 = (code *)uVar6;
  auStack_5c0 = uv_buf_init("PING",4);
  pcStack_5c8 = (code *)0x189a63;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_5b0);
  if (iVar1 == 0) {
    pcStack_5c8 = (code *)0x189a70;
    uVar3 = create_udp_socket();
    uVar6 = (ulong)uVar3;
    pcStack_5c8 = (code *)0x189a77;
    uVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x189a84;
    iVar1 = uv_udp_init(uVar4,auStack_5a0);
    if (iVar1 != 0) goto LAB_00189bb9;
    pcStack_5c8 = (code *)0x189a9d;
    iVar1 = connect(uVar3,&sStack_5b0,0x10);
    if (iVar1 != 0) goto LAB_00189bbe;
    pcStack_5c8 = (code *)0x189ab1;
    iVar1 = uv_udp_open(auStack_5a0,uVar3);
    if (iVar1 != 0) goto LAB_00189bc3;
    pcStack_5c8 = (code *)0x189abe;
    uVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x189ace;
    iVar1 = uv_udp_init(uVar4,auStack_4c8);
    if (iVar1 != 0) goto LAB_00189bc8;
    pcStack_5c8 = (code *)0x189aea;
    iVar1 = uv_udp_bind(auStack_4c8,&sStack_5b0,0);
    if (iVar1 != 0) goto LAB_00189bcd;
    pcStack_5c8 = (code *)0x189b0d;
    iVar1 = uv_udp_recv_start(auStack_4c8,alloc_cb,recv_cb);
    if (iVar1 != 0) goto LAB_00189bd2;
    pcStack_5c8 = (code *)0x189b38;
    iVar1 = uv_udp_send(&send_req,auStack_5a0,auStack_5c0,1,0,send_cb);
    if (iVar1 != 0) goto LAB_00189bd7;
    pcStack_5c8 = (code *)0x189b45;
    uVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x189b4f;
    uv_run(uVar4,0);
    if (send_cb_called != 1) goto LAB_00189bdc;
    if (close_cb_called != 2) goto LAB_00189be1;
    if (lStack_540 != 0) goto LAB_00189be6;
    pcStack_5c8 = (code *)0x189b75;
    uVar6 = uv_default_loop();
    pcStack_5c8 = (code *)0x189b89;
    uv_walk(uVar6,close_walk_cb,0);
    pcStack_5c8 = (code *)0x189b93;
    uv_run(uVar6,0);
    pcStack_5c8 = (code *)0x189b98;
    uVar4 = uv_default_loop();
    pcStack_5c8 = (code *)0x189ba0;
    iVar1 = uv_loop_close(uVar4);
    if (iVar1 == 0) {
      pcStack_5c8 = (code *)0x189ba9;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_5c8 = (code *)0x189bb9;
    run_test_udp_open_connect_cold_1();
LAB_00189bb9:
    pcStack_5c8 = (code *)0x189bbe;
    run_test_udp_open_connect_cold_2();
LAB_00189bbe:
    pcStack_5c8 = (code *)0x189bc3;
    run_test_udp_open_connect_cold_3();
LAB_00189bc3:
    pcStack_5c8 = (code *)0x189bc8;
    run_test_udp_open_connect_cold_4();
LAB_00189bc8:
    pcStack_5c8 = (code *)0x189bcd;
    run_test_udp_open_connect_cold_5();
LAB_00189bcd:
    pcStack_5c8 = (code *)0x189bd2;
    run_test_udp_open_connect_cold_6();
LAB_00189bd2:
    pcStack_5c8 = (code *)0x189bd7;
    run_test_udp_open_connect_cold_7();
LAB_00189bd7:
    pcStack_5c8 = (code *)0x189bdc;
    run_test_udp_open_connect_cold_8();
LAB_00189bdc:
    pcStack_5c8 = (code *)0x189be1;
    run_test_udp_open_connect_cold_9();
LAB_00189be1:
    pcStack_5c8 = (code *)0x189be6;
    run_test_udp_open_connect_cold_10();
LAB_00189be6:
    pcStack_5c8 = (code *)0x189beb;
    run_test_udp_open_connect_cold_11();
  }
  pcStack_5c8 = run_test_udp_send_unix;
  run_test_udp_open_connect_cold_12();
  uStack_5d0 = uVar6;
  pcStack_5c8 = (code *)(ulong)uVar2;
  auStack_868 = uv_buf_init("PING",4);
  puVar5 = (undefined1 *)uv_default_loop();
  uStack_845 = 0;
  uStack_840 = 0;
  uStack_838 = 0;
  uStack_830 = 0;
  uStack_828 = 0;
  uStack_820 = 0;
  uStack_818 = 0;
  uStack_810 = 0;
  uStack_808 = 0;
  uStack_800 = 0;
  uStack_7fa = 0;
  uStack_7f8 = 0;
  uStack_7f2 = 0;
  sStack_858.sa_family = 1;
  builtin_strncpy(sStack_858.sa_data,"/tmp/uv-test-s",0xe);
  uStack_848 = 0x636f;
  uStack_846 = 0x6b;
  puVar8 = (undefined1 *)0x1;
  uVar2 = socket(1,1,0);
  if ((int)uVar2 < 0) {
    run_test_udp_send_unix_cold_1();
LAB_00189d89:
    run_test_udp_send_unix_cold_2();
LAB_00189d8e:
    run_test_udp_send_unix_cold_3();
LAB_00189d93:
    run_test_udp_send_unix_cold_4();
LAB_00189d98:
    run_test_udp_send_unix_cold_5();
  }
  else {
    unlink("/tmp/uv-test-sock");
    puVar8 = (undefined1 *)(ulong)uVar2;
    iVar1 = bind(uVar2,&sStack_858,0x6e);
    if (iVar1 != 0) goto LAB_00189d89;
    puVar8 = (undefined1 *)(ulong)uVar2;
    iVar1 = listen(uVar2,1);
    if (iVar1 != 0) goto LAB_00189d8e;
    puVar8 = puVar5;
    iVar1 = uv_udp_init(puVar5,auStack_7e8);
    if (iVar1 != 0) goto LAB_00189d93;
    puVar8 = auStack_7e8;
    iVar1 = uv_udp_open(puVar8,uVar2);
    if (iVar1 != 0) goto LAB_00189d98;
    uv_run(puVar5,0);
    puVar8 = auStack_710;
    iVar1 = uv_udp_send(puVar8,auStack_7e8,auStack_868,1,&sStack_858,0);
    if (iVar1 == 0) {
      uv_close(auStack_7e8,0);
      uv_run(puVar5,0);
      close(uVar2);
      unlink("/tmp/uv-test-sock");
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      puVar8 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close();
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00189da2;
    }
  }
  run_test_udp_send_unix_cold_6();
LAB_00189da2:
  run_test_udp_send_unix_cold_7();
  if (puVar8 != (undefined1 *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_00;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar8,0);
  return iVar1;
}

Assistant:

TEST_IMPL(udp_open) {
  struct sockaddr_in addr;
  uv_buf_t buf = uv_buf_init("PING", 4);
  uv_udp_t client, client2;
  uv_os_sock_t sock;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  startup();
  sock = create_udp_socket();

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_udp_open(&client, sock);
  ASSERT(r == 0);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT(r == 0);

  r = uv_udp_send(&send_req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

#ifndef _WIN32
  {
    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT(r == 0);

    r = uv_udp_open(&client2, sock);
    ASSERT(r == UV_EEXIST);

    uv_close((uv_handle_t*) &client2, NULL);
  }
#else  /* _WIN32 */
  (void)client2;
#endif

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(send_cb_called == 1);
  ASSERT(close_cb_called == 1);

  ASSERT(client.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}